

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O0

LayoutBindingTestResult * __thiscall
glcts::AtomicCounterLayoutBindingCase::binding_basic_render
          (LayoutBindingTestResult *__return_storage_ptr__,AtomicCounterLayoutBindingCase *this)

{
  String local_38;
  AtomicCounterLayoutBindingCase *local_18;
  AtomicCounterLayoutBindingCase *this_local;
  
  local_18 = this;
  this_local = (AtomicCounterLayoutBindingCase *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)&local_38);
  LayoutBindingTestResult::LayoutBindingTestResult(__return_storage_ptr__,true,&local_38,false);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

LayoutBindingTestResult binding_basic_render(void)
	{
		return true;
	}